

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O2

void __thiscall
embree::sse2::
HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
splitFallback(HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>
              *this,PrimInfoExtRange *set,PrimInfoExtRange *lset,PrimInfoExtRange *rset)

{
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Vec3fx VVar3;
  unsigned_long uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar9;
  ulong uVar10;
  size_t lweight;
  unsigned_long uVar11;
  size_t rweight;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar12;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar13;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar14;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar15;
  undefined1 auVar16 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar17;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  
  uVar4 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  uVar5 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  uVar8 = uVar5 + uVar4 >> 1;
  paVar9 = &this->prims0[uVar4].upper.field_0;
  lweight = 0;
  aVar12 = _DAT_01f45a40;
  aVar13 = _DAT_01f45a30;
  aVar14 = _DAT_01f45a40;
  aVar15 = _DAT_01f45a30;
  for (uVar11 = uVar4; uVar11 < uVar8; uVar11 = uVar11 + 1) {
    aVar1 = paVar9[-1].field_1;
    aVar2 = paVar9->field_1;
    aVar15.m128 = (__m128)minps(aVar15.m128,(undefined1  [16])aVar1);
    aVar14.m128 = (__m128)maxps(aVar14.m128,(undefined1  [16])aVar2);
    auVar16._0_4_ = aVar1.x + aVar2.x;
    auVar16._4_4_ = aVar1.y + aVar2.y;
    auVar16._8_4_ = aVar1.z + aVar2.z;
    auVar16._12_4_ = aVar1.field_3.w + aVar2.field_3.w;
    aVar13.m128 = (__m128)minps(aVar13.m128,auVar16);
    aVar12.m128 = (__m128)maxps(aVar12.m128,auVar16);
    lweight = lweight + (paVar9[-1].field_1.field_3.u >> 0x1b);
    paVar9 = paVar9 + 2;
  }
  paVar9 = &this->prims0[uVar8].upper.field_0;
  rweight = 0;
  aVar17 = _DAT_01f45a40;
  aVar18 = _DAT_01f45a30;
  aVar19 = _DAT_01f45a40;
  aVar20 = _DAT_01f45a30;
  for (uVar10 = uVar8; uVar10 < uVar5; uVar10 = uVar10 + 1) {
    aVar1 = paVar9[-1].field_1;
    VVar3.field_0 =
         (anon_union_16_2_47237d3f_for_Vec3fx_0)
         *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)&paVar9->field_1;
    aVar20.m128 = (__m128)minps(aVar20.m128,(undefined1  [16])aVar1);
    aVar19.m128 = (__m128)maxps(aVar19.m128,(undefined1  [16])VVar3.field_0);
    fVar21 = aVar1.x + VVar3.field_0._0_4_;
    fVar22 = aVar1.y + VVar3.field_0._4_4_;
    fVar23 = aVar1.z + VVar3.field_0._8_4_;
    fVar24 = aVar1.field_3.w + VVar3.field_0._12_4_;
    auVar6._4_4_ = fVar22;
    auVar6._0_4_ = fVar21;
    auVar6._8_4_ = fVar23;
    auVar6._12_4_ = fVar24;
    aVar18.m128 = (__m128)minps(aVar18.m128,auVar6);
    auVar7._4_4_ = fVar22;
    auVar7._0_4_ = fVar21;
    auVar7._8_4_ = fVar23;
    auVar7._12_4_ = fVar24;
    aVar17.m128 = (__m128)maxps(aVar17.m128,auVar7);
    rweight = rweight + (paVar9[-1].field_1.field_3.u >> 0x1b);
    paVar9 = paVar9 + 2;
  }
  (lset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar15;
  (lset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = aVar14;
  (lset->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar13;
  (lset->super_CentGeomBBox3fa).centBounds.upper.field_0 = aVar12;
  (lset->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin = uVar4;
  (lset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end = uVar8;
  (lset->super_extended_range<unsigned_long>)._ext_end = uVar8;
  (rset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar20;
  (rset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = aVar19;
  (rset->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar18;
  (rset->super_CentGeomBBox3fa).centBounds.upper.field_0 = aVar17;
  (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin = uVar8;
  (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end = uVar5;
  (rset->super_extended_range<unsigned_long>)._ext_end = uVar5;
  if ((set->super_extended_range<unsigned_long>)._ext_end ==
      (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end) {
    return;
  }
  setExtentedRanges(this,set,lset,rset,lweight,rweight);
  moveExtentedRange(this,set,lset,rset);
  return;
}

Assistant:

void splitFallback(const PrimInfoExtRange& set, 
                           PrimInfoExtRange& lset, 
                           PrimInfoExtRange& rset)
        {
          const size_t begin = set.begin();
          const size_t end   = set.end();
          const size_t center = (begin + end)/2;

          PrimInfo left(empty);
          for (size_t i=begin; i<center; i++) {
            left.add_center2(prims0[i],prims0[i].lower.u >> (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS));
          }
          const size_t lweight = left.end;
          
          PrimInfo right(empty);
          for (size_t i=center; i<end; i++) {
            right.add_center2(prims0[i],prims0[i].lower.u >> (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS));	
          }
          const size_t rweight = right.end;

          new (&lset) PrimInfoExtRange(begin,center,center,left);
          new (&rset) PrimInfoExtRange(center,end,end,right);

          /* if we have an extended range */
          if (set.has_ext_range()) {
            setExtentedRanges(set,lset,rset,lweight,rweight);
            moveExtentedRange(set,lset,rset);
          }
        }